

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O2

Connection
QObject::connect<void(QAbstractButton::*)(bool),void(QAbstractItemView::*)()>
          (Object *sender,offset_in_QAbstractButton_to_subr signal,ContextType *context,
          offset_in_QAbstractItemView_to_subr *slot,ConnectionType type)

{
  ImplFn p_Var1;
  undefined4 *puVar2;
  QMetaObject *pQVar3;
  undefined4 in_register_00000084;
  QSlotObjectBase *in_R9;
  long in_FS_OFFSET;
  uint in_stack_00000008;
  ContextType *local_48;
  offset_in_QAbstractItemView_to_subr *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QMetaObject *)0x0;
  if ((in_stack_00000008 & 0xfffffffe) == 2) {
    pQVar3 = (QMetaObject *)&QtPrivate::ConnectionTypes<QtPrivate::List<bool>,true>::types()::t;
  }
  local_48 = context;
  local_40 = slot;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(),_QtPrivate::List<>,_void>::impl;
  p_Var1 = in_R9->m_impl;
  *(undefined8 *)(puVar2 + 4) = *(undefined8 *)in_R9;
  *(ImplFn *)(puVar2 + 6) = p_Var1;
  QObject::connectImpl
            ((QObject *)sender,(void **)signal,(QObject *)&local_48,
             (void **)CONCAT44(in_register_00000084,type),in_R9,(ConnectionType)puVar2,
             (int *)(ulong)in_stack_00000008,pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Connection)sender;
  }
  __stack_chk_fail();
}

Assistant:

static inline QMetaObject::Connection
        connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                const typename QtPrivate::ContextTypeForFunctor<Func2>::ContextType *context, Func2 &&slot,
                Qt::ConnectionType type = Qt::AutoConnection)
    {
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        typedef QtPrivate::FunctionPointer<std::decay_t<Func2>> SlotType;

        if constexpr (SlotType::ArgumentCount != -1) {
            static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        } else {
            constexpr int FunctorArgumentCount = QtPrivate::ComputeFunctorArgumentCount<std::decay_t<Func2>, typename SignalType::Arguments>::Value;
            [[maybe_unused]]
            constexpr int SlotArgumentCount = (FunctorArgumentCount >= 0) ? FunctorArgumentCount : 0;
            typedef typename QtPrivate::FunctorReturnType<std::decay_t<Func2>, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotArgumentCount>::Value>::type SlotReturnType;

            static_assert((QtPrivate::AreArgumentsCompatible<SlotReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        }

        static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                          "No Q_OBJECT in the class with the signal");

        //compilation error if the arguments does not match.
        static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                          "The slot requires more arguments than the signal provides.");

        const int *types = nullptr;
        if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
            types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

        void **pSlot = nullptr;
        if constexpr (std::is_member_function_pointer_v<std::decay_t<Func2>>) {
            pSlot = const_cast<void **>(reinterpret_cast<void *const *>(&slot));
        } else {
            Q_ASSERT_X((type & Qt::UniqueConnection) == 0, "",
                       "QObject::connect: Unique connection requires the slot to be a pointer to "
                       "a member function of a QObject subclass.");
        }

        return connectImpl(sender, reinterpret_cast<void **>(&signal), context, pSlot,
                           QtPrivate::makeCallableObject<Func1>(std::forward<Func2>(slot)),
                           type, types, &SignalType::Object::staticMetaObject);
    }